

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

int supsmu_(int *n,double *x,double *y,double *w,int *iper,double *span,double *alpha,double *smo,
           double *sc)

{
  double *pdVar1;
  int iVar2;
  uint uVar4;
  ulong in_RAX;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double local_90;
  double h__;
  double *local_80;
  double *local_78;
  uint *local_70;
  double local_68;
  double *local_60;
  double *local_58;
  ulong local_50;
  undefined1 local_44 [4];
  double local_40;
  double vsmlsq;
  uint uVar3;
  
  uVar4 = *n;
  uVar7 = (ulong)(int)uVar4;
  if (x[uVar7 - 1] <= *x) {
    if (0 < (int)uVar4) {
      dVar14 = 0.0;
      in_RAX = 0;
      dVar13 = 0.0;
      do {
        dVar14 = dVar14 + y[in_RAX] * w[in_RAX];
        dVar13 = dVar13 + w[in_RAX];
        in_RAX = in_RAX + 1;
      } while (uVar4 != in_RAX);
      if (0 < (int)uVar4) {
        in_RAX = 0;
        do {
          smo[in_RAX] = (double)(-(ulong)(0.0 < dVar13) & (ulong)(dVar14 / dVar13));
          in_RAX = in_RAX + 1;
        } while (uVar4 != in_RAX);
      }
    }
  }
  else {
    uVar3 = uVar4 + 3;
    if (-1 < (int)uVar4) {
      uVar3 = uVar4;
    }
    iVar2 = (int)uVar3 >> 2;
    iVar9 = iVar2 * 3;
    dVar14 = x[(long)iVar9 + -1] - x[(long)iVar2 + -1];
    while (dVar14 <= 0.0) {
      iVar9 = iVar9 + (uint)(iVar9 < (int)uVar4);
      iVar2 = iVar2 - (uint)(1 < iVar2);
      dVar14 = x[(long)iVar9 + -1] - x[(long)iVar2 + -1];
    }
    local_40 = dVar14 * consts_.e_1[2] * dVar14 * consts_.e_1[2];
    iVar9 = 2 - (uint)(*x < 0.0 || 1.0 < x[uVar7 - 1]);
    if ((int)iper != 2) {
      iVar9 = (int)iper;
    }
    local_44 = (undefined1  [4])1;
    if (0xfffffffd < iVar9 - 3U) {
      local_44 = (undefined1  [4])iVar9;
    }
    if (*span <= 0.0) {
      uVar8 = ~uVar7;
      local_58 = sc + uVar8;
      h__ = (double)(local_58 + uVar7 * 7 + 1);
      vsmlsq._4_4_ = -(int)local_44;
      pdVar11 = sc + uVar7 + uVar8 + 1;
      local_68 = (double)(uVar7 * 0x10);
      pdVar12 = sc + uVar8 + uVar7 * 2 + 1;
      lVar10 = 0;
      local_80 = x;
      local_78 = w;
      local_70 = (uint *)n;
      local_60 = y;
      local_50 = uVar7;
      do {
        smooth_(n,local_80,local_60,w,(double *)((long)spans_.e_1 + lVar10),(int *)local_44,
                &local_40,pdVar11,(double *)h__);
        vsmlsq._0_4_ = vsmlsq._4_4_;
        smooth_(n,local_80,(double *)h__,w,spans_.e_1 + 1,(int *)&vsmlsq,&local_40,pdVar12,&local_90
               );
        pdVar1 = local_58;
        pdVar11 = (double *)((long)pdVar11 + (long)local_68);
        pdVar12 = (double *)((long)pdVar12 + (long)local_68);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      uVar3 = *local_70;
      uVar4 = uVar4 * 2;
      pdVar11 = local_58;
      pdVar12 = (double *)h__;
      if (0 < (int)uVar3) {
        local_60 = local_58 + local_50 * 6;
        lVar10 = 1;
        do {
          lVar6 = 0;
          dVar14 = consts_.e_1[0];
          uVar5 = uVar4;
          do {
            dVar13 = pdVar11[lVar10 + (int)uVar5];
            if (dVar13 < dVar14) {
              pdVar1[uVar7 * 7 + lVar10] = *(double *)((long)spans_.e_1 + lVar6);
              dVar14 = dVar13;
            }
            lVar6 = lVar6 + 8;
            uVar5 = uVar5 + uVar4;
          } while (lVar6 != 0x18);
          if ((((0.0 < *alpha) && (*alpha <= 10.0)) && (0.0 < dVar14)) &&
             (dVar14 < local_60[lVar10])) {
            dVar14 = pmax(consts_.e_1[1],dVar14 / local_60[lVar10]);
            local_68 = spans_.e_1[2] - pdVar1[uVar7 * 7 + lVar10];
            dVar14 = pow(dVar14,10.0 - *alpha);
            pdVar1[uVar7 * 7 + lVar10] = dVar14 * local_68 + pdVar1[uVar7 * 7 + lVar10];
            pdVar11 = local_58;
            pdVar12 = (double *)h__;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != (ulong)uVar3 + 1);
      }
      n = (int *)local_70;
      x = local_80;
      vsmlsq._0_4_ = vsmlsq._4_4_;
      smooth_((int *)local_70,local_80,pdVar12,local_78,spans_.e_1 + 1,(int *)&vsmlsq,&local_40,
              pdVar11 + (int)(uVar4 | 1),&local_90);
      uVar3 = *n;
      iVar9 = (int)local_50;
      if (0 < (int)uVar3) {
        lVar10 = (long)(int)uVar4 * 8 + 8;
        lVar6 = 0;
        do {
          dVar13 = spans_.e_1[0];
          dVar14 = *(double *)((long)pdVar11 + lVar6 + lVar10);
          if (dVar14 <= spans_.e_1[0]) {
            *(double *)((long)pdVar11 + lVar6 + lVar10) = spans_.e_1[0];
            dVar14 = dVar13;
          }
          dVar13 = spans_.e_1[2];
          if (spans_.e_1[2] <= dVar14) {
            *(double *)((long)pdVar11 + lVar6 + lVar10) = spans_.e_1[2];
            dVar14 = dVar13;
          }
          dVar14 = dVar14 - spans_.e_1[1];
          if (0.0 <= dVar14) {
            dVar14 = dVar14 / (spans_.e_1[2] - spans_.e_1[1]);
            uVar7 = local_50 * 5;
          }
          else {
            dVar14 = -dVar14 / (spans_.e_1[1] - spans_.e_1[0]);
            uVar7 = local_50;
          }
          *(double *)((long)pdVar11 + lVar6 + (long)(iVar9 * 4) * 8 + 8) =
               (1.0 - dVar14) * *(double *)((long)pdVar11 + lVar6 + (long)(iVar9 * 3) * 8 + 8) +
               dVar14 * *(double *)((long)sc + lVar6 + uVar7 * 8 + uVar8 * 8 + 8);
          lVar6 = lVar6 + 8;
        } while ((ulong)uVar3 << 3 != lVar6);
      }
      sc = &local_90;
      pdVar11 = &vsmlsq;
      vsmlsq._0_4_ = vsmlsq._4_4_;
      y = local_58 + (int)(iVar9 * 4 | 1);
      w = local_78;
      span = spans_.e_1;
    }
    else {
      pdVar11 = (double *)local_44;
    }
    uVar4 = smooth_(n,x,y,w,span,(int *)pdVar11,&local_40,smo,sc);
    in_RAX = (ulong)uVar4;
  }
  return (int)in_RAX;
}

Assistant:

static int supsmu_(int *n, double *x, double *y, double *w, int *iper, double *span, double *alpha, double *smo, double *sc)
{
    /* System generated locals */
    int sc_dim1, sc_offset, i__1;
    double r__1, r__2;
    double d__1, d__2;

    /* Local variables */
    double a, f, h__;
    int i__, j;
    double sw, sy;
    int jper;
    double scale, resmin;
    double vsmlsq;


/* ------------------------------------------------------------------ */

/* super-smoother. */

/* Friedman J.H. (1984). A variable span smoother. Department of Statistics, */
/*    Stanford University, Technical Report LCS5. */

/* version 10/10/84. */

/* coded  and copyright (c) 1984 by: */

/*                        Jerome H. Friedman */
/*                     Department of Statistics */
/*                               and */
/*                Stanford Linear Accelerator Center */
/*                        Stanford University */

/* all rights reserved. */


/* input: */
/*    n : number of observations (x,y - pairs). */
/*    x(n) : ordered abscissa values. */
/*    y(n) : corresponding ordinate (response) values. */
/*    w(n) : weight for each (x,y) observation. */
/*    iper : periodic variable flag. */
/*       iper=1 => x is ordered interval variable. */
/*       iper=2 => x is a periodic variable with values */
/*                 in the range (0.0,1.0) and period 1.0. */
/*    span : smoother span (fraction of observations in window). */
/*           span=0.0 => automatic (variable) span selection. */
/*    alpha : controles high frequency (small span) penality */
/*            used with automatic span selection (bass tone control). */
/*            (alpha.le.0.0 or alpha.gt.10.0 => no effect.) */
/* output: */
/*   smo(n) : smoothed ordinate (response) values. */
/* scratch: */
/*   sc(n,7) : internal working storage. */

/* note: */
/*    for small samples (n < 40) or if there are substantial serial */
/*    correlations between obserations close in x - value, then */
/*    a prespecified fixed span smoother (span > 0) should be */
/*    used. reasonable span values are 0.2 to 0.4. */

/* ------------------------------------------------------------------ */

    /* Parameter adjustments */
    sc_dim1 = *n;
    sc_offset = 1 + sc_dim1;
    sc -= sc_offset;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    if (x[*n] > x[1]) {
	goto L30;
    }
    sy = 0.0;
    sw = sy;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sy += w[j] * y[j];
	sw += w[j];
/* L10: */
    }
    a = 0.0;
    if (sw > 0.0) {
	a = sy / sw;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	smo[j] = a;
/* L20: */
    }
    return 0;
L30:
    i__ = *n / 4;
    j = i__ * 3;
    scale = x[j] - x[i__];
L40:
    if (scale > 0.f) {
	goto L50;
    }
    if (j < *n) {
	++j;
    }
    if (i__ > 1) {
	--i__;
    }
    scale = x[j] - x[i__];
    goto L40;
L50:
/* Computing 2nd power */
    r__1 = consts_1.eps * scale;
    vsmlsq = r__1 * r__1;
    jper = *iper;
    if (*iper == 2 && (x[1] < 0.0 || x[*n] > 1.0)) {
	jper = 1;
    }
    if (jper < 1 || jper > 2) {
	jper = 1;
    }
    if (*span <= 0.0) {
	goto L60;
    }
    smooth_(n, &x[1], &y[1], &w[1], span, &jper, &vsmlsq, &smo[1], &sc[
	    sc_offset]);
    return 0;
L60:
    for (i__ = 1; i__ <= 3; ++i__) {
	smooth_(n, &x[1], &y[1], &w[1], &spans_1.spans[i__ - 1], &jper, &
		vsmlsq, &sc[((i__ << 1) - 1) * sc_dim1 + 1], &sc[sc_dim1 * 7 
		+ 1]);
	i__1 = -jper;
	smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &
		i__1, &vsmlsq, &sc[(i__ << 1) * sc_dim1 + 1], &h__);
/* L70: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	resmin = consts_1.big;
	for (i__ = 1; i__ <= 3; ++i__) {
	    if (sc[j + (i__ << 1) * sc_dim1] >= resmin) {
		goto L80;
	    }
	    resmin = sc[j + (i__ << 1) * sc_dim1];
	    sc[j + sc_dim1 * 7] = spans_1.spans[i__ - 1];
L80:
	    ;
	}
	if (*alpha > 0.f && *alpha <= 10.f && resmin < sc[j + sc_dim1 * 6] && 
		resmin > 0.f) {
/* Computing MAX */
	    r__1 = consts_1.sml, r__2 = resmin / sc[j + sc_dim1 * 6];
	    d__1 = (double) pmax(r__1,r__2);
	    d__2 = (double) (10.0 - *alpha);
	    sc[j + sc_dim1 * 7] += (spans_1.spans[2] - sc[j + sc_dim1 * 7]) * 
		    pow(d__1, d__2);
	}
/* L90: */
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &i__1, &
	    vsmlsq, &sc[(sc_dim1 << 1) + 1], &h__);
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (sc[j + (sc_dim1 << 1)] <= spans_1.spans[0]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[0];
	}
	if (sc[j + (sc_dim1 << 1)] >= spans_1.spans[2]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[2];
	}
	f = sc[j + (sc_dim1 << 1)] - spans_1.spans[1];
	if (f >= 0.f) {
	    goto L100;
	}
	f = -f / (spans_1.spans[1] - spans_1.spans[0]);
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1];
	goto L110;
L100:
	f /= spans_1.spans[2] - spans_1.spans[1];
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1 * 5];
L110:
	;
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[(sc_dim1 << 2) + 1], &w[1], spans_1.spans, &i__1, &
	    vsmlsq, &smo[1], &h__);
    return 0;
}